

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmain.h
# Opt level: O2

Api find_audio_api(char *id)

{
  int iVar1;
  size_t i;
  long lVar2;
  char **ppcVar3;
  
  ppcVar3 = audio_api_ids;
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 10) {
      return UNSPECIFIED;
    }
    iVar1 = strcmp(id,*ppcVar3);
    if (iVar1 == 0) break;
    lVar2 = lVar2 + 1;
    ppcVar3 = ppcVar3 + 1;
  }
  return (Api)lVar2;
}

Assistant:

inline RtAudio::Api find_audio_api(const char *id)
{
    for (size_t i = 0; i < audio_api_count; ++i)
        if (!strcmp(id, audio_api_ids[i]))
            return (RtAudio::Api)i;
    return RtAudio::UNSPECIFIED;
}